

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O2

void __thiscall CHog::calcDiff(CHog *this,uchar *image,double **magnitudeTable)

{
  uint uVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int **ppiVar7;
  int **ppiVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  
  iVar19 = 0;
  lVar13 = 0;
  while (lVar16 = lVar13, lVar16 < this->imgHeight) {
    ppiVar7 = this->dx;
    ppiVar8 = this->dy;
    iVar11 = (int)lVar16;
    lVar13 = 0;
    while (lVar20 = lVar13, iVar5 = this->imgWidth, lVar13 = lVar16 + 1, lVar20 < iVar5) {
      iVar12 = (int)lVar20;
      iVar17 = this->widthStep * iVar11 + iVar19;
      iVar14 = (int)(lVar20 + 1);
      piVar9 = ppiVar7[lVar16];
      piVar9[lVar20] =
           (uint)image[((iVar12 + iVar5 + -1) % iVar5) * this->imgChannel + iVar17] -
           (uint)image[((iVar14 + iVar5) % iVar5) * this->imgChannel + iVar17];
      iVar5 = this->imgHeight;
      iVar19 = this->imgChannel * iVar12 + iVar19;
      bVar3 = image[((iVar5 + iVar11 + -1) % iVar5) * this->widthStep + iVar19];
      iVar17 = (int)(lVar16 + 1);
      bVar4 = image[((iVar5 + iVar17) % iVar5) * this->widthStep + iVar19];
      piVar10 = ppiVar8[lVar16];
      piVar10[lVar20] = (int)((ulong)bVar3 - (ulong)bVar4);
      dVar2 = magnitudeTable[((ulong)bVar3 - (ulong)bVar4) + 0xff][(long)piVar9[lVar20] + 0xff];
      for (iVar19 = 1; iVar5 = this->imgChannel, lVar13 = lVar20 + 1, iVar19 < iVar5;
          iVar19 = iVar19 + 1) {
        iVar6 = this->imgHeight;
        iVar18 = this->widthStep;
        iVar15 = iVar12 * iVar5 + iVar19;
        bVar3 = image[((iVar11 + -1 + iVar6) % iVar6) * iVar18 + iVar15];
        bVar4 = image[((iVar17 + iVar6) % iVar6) * iVar18 + iVar15];
        uVar1 = ((uint)bVar3 - (uint)bVar4) + 0xff;
        if ((double)(int)dVar2 < magnitudeTable[uVar1][uVar1]) {
          iVar6 = this->imgWidth;
          iVar18 = iVar18 * iVar11 + iVar19;
          piVar9[lVar20] =
               (uint)image[((iVar6 + iVar12 + -1) % iVar6) * iVar5 + iVar18] -
               (uint)image[((iVar14 + iVar6) % iVar6) * iVar5 + iVar18];
          piVar10[lVar20] = (uint)bVar3 - (uint)bVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void CHog::calcDiff(unsigned char* image, double** magnitudeTable) //图像数据
{
    int x=0, y=0, c=0;
    int xDiffs, yDiffs, magni;
    //cout<<"calculating differential"<<endl;
    //遍历图像//
    for(y=0; y<imgHeight; y++)
    {
        for(x=0; x<imgWidth; x++)
        {
            dx[y][x] = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
            dy[y][x] = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
            magni = magnitudeTable[dy[y][x]+255][dx[y][x]+255];
            for(c=1; c<imgChannel; c++)
            {
                xDiffs = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
                yDiffs = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
                if(magni < magnitudeTable[yDiffs+255][yDiffs+255])
                {
                    dx[y][x] = xDiffs;
                    dy[y][x] = yDiffs;
                }
            }

        }
    }
    //cout<<"differential calculated\t"<<endl;
}